

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curve.h
# Opt level: O2

Vector __thiscall
anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>::point_at
          (Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_> *this,double t)

{
  double extraout_XMM0_Qa;
  double in_XMM1_Qa;
  Vector VVar1;
  Pointer<anurbs::NurbsCurveGeometry<2L>_> PVar2;
  Ref<anurbs::NurbsCurveGeometry<2L>_> local_20;
  
  PVar2 = Ref<anurbs::NurbsCurveGeometry<2L>_>::data(&local_20);
  (*((local_20.m_entry.
      super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
     ._M_ptr)->super_EntryBase)._vptr_EntryBase[5])
            (t,this,local_20.m_entry.
                    super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr,
             PVar2.super___shared_ptr<anurbs::NurbsCurveGeometry<2L>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._M_pi);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.m_entry.
              super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  VVar1.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[1] =
       in_XMM1_Qa;
  VVar1.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[0] =
       extraout_XMM0_Qa;
  return (Vector)VVar1.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data
                 .array;
}

Assistant:

Vector point_at(const double t) const override
    {
        return m_curve_geometry->point_at(t);
    }